

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O0

vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> * __thiscall
anon_unknown.dwarf_4cc9d::CliqueRunner::unpermute_and_finish
          (CliqueRunner *this,vector<int,_std::allocator<int>_> *v)

{
  anon_class_8_1_54a39817_for__M_pred __pred;
  bool bVar1;
  iterator __first;
  undefined8 in_RDX;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *in_RSI;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *in_RDI;
  int w_1;
  int *w;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *result;
  __normal_iterator<std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
  in_stack_ffffffffffffff58;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *__args;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  int local_58 [5];
  undefined1 local_41;
  reference local_40;
  int *local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  undefined8 local_28;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  __args = in_RDI;
  local_18 = in_RDX;
  std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::vector
            ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)0x128626);
  local_28 = local_18;
  local_30._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff58._M_current);
  local_38 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_ffffffffffffff58._M_current);
  while (bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)in_stack_ffffffffffffff58._M_current),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_40 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_30);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)
               &in_RSI[4].
                super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)*local_40);
    local_41 = 1;
    std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>::emplace_back<int&,bool>
              (in_RSI,(int *)__args,(bool *)in_RDI);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_30);
  }
  for (local_58[0] = 0;
      local_58[0] <
      *(int *)&in_RSI[2].
               super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
               _M_impl.super__Vector_impl_data._M_finish; local_58[0] = local_58[0] + 1) {
    std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::end
              ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
               in_stack_ffffffffffffff58._M_current);
    std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::begin
              ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
               in_stack_ffffffffffffff58._M_current);
    __first = std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::end
                        (in_stack_ffffffffffffff58._M_current);
    __pred.w._7_1_ = in_stack_ffffffffffffff7f;
    __pred.w._0_7_ = in_stack_ffffffffffffff78;
    in_stack_ffffffffffffff58 =
         std::
         find_if<__gnu_cxx::__normal_iterator<std::pair<int,bool>*,std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>>,(anonymous_namespace)::CliqueRunner::unpermute_and_finish(std::vector<int,std::allocator<int>>&)::_lambda(auto:1&)_1_>
                   (__first._M_current,(pair<int,_bool> *)local_58,__pred);
    bVar1 = __gnu_cxx::
            operator==<std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                      ((__normal_iterator<std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                        *)in_stack_ffffffffffffff58._M_current);
    if (bVar1) {
      in_stack_ffffffffffffff7f = 0;
      std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>::emplace_back<int&,bool>
                (in_RSI,(int *)__args,(bool *)in_RDI);
    }
  }
  return __args;
}

Assistant:

auto unpermute_and_finish(
            vector<int> & v) -> vector<pair<int, bool>>
        {
            vector<pair<int, bool>> result;
            for (auto & w : v)
                result.emplace_back(order[w], true);
            for (int w = 0; w < size; ++w)
                if (result.end() == find_if(result.begin(), result.end(), [&](auto & x) { return x.first == w; }))
                    result.emplace_back(w, false);
            return result;
        }